

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

ProString * __thiscall ProString::append(ProString *this,ProString *other,bool *pending)

{
  QStringView v;
  QStringView *this_00;
  QStringView *pQVar1;
  qsizetype qVar2;
  byte *in_RDX;
  QString *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString *in_stack_ffffffffffffff08;
  QString *this_01;
  ProString *in_stack_ffffffffffffff10;
  QString *in_stack_ffffffffffffff18;
  QStringView *in_stack_ffffffffffffff20;
  QStringBuilder<QLatin1Char,_QStringView> *in_stack_ffffffffffffff38;
  QString *in_stack_ffffffffffffff40;
  QLatin1Char local_59 [65];
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((long)&in_RSI[1].d.d + 4) != 0) {
    if (in_RDI->m_length == 0) {
      operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      this_00 = (QStringView *)(long)in_RDI->m_length;
      pQVar1 = (QStringView *)QString::size(&in_RDI->m_string);
      if (this_00 != pQVar1) {
        toQString(in_stack_ffffffffffffff08);
        QString::operator=(&in_stack_ffffffffffffff10->m_string,&in_stack_ffffffffffffff08->m_string
                          );
        QString::~QString((QString *)0x32edc4);
      }
      if ((in_RDX == (byte *)0x0) || ((*in_RDX & 1) != 0)) {
        this_01 = in_RSI;
        QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
        ;
        QStringView::mid(this_00,(qsizetype)in_stack_ffffffffffffff38,(qsizetype)in_RDI);
        v.m_data = (storage_type_conflict *)this_00;
        v.m_size = (qsizetype)in_stack_ffffffffffffff20;
        QString::operator+=(this_01,v);
      }
      else {
        QLatin1Char::QLatin1Char(local_59,' ');
        QStringView::QStringView<QString,_true>(&local_18,in_RSI);
        QStringView::mid(this_00,(qsizetype)in_stack_ffffffffffffff38,(qsizetype)in_RDI);
        ::operator+((QLatin1Char *)in_stack_ffffffffffffff10,
                    (QStringView *)in_stack_ffffffffffffff08);
        ::operator+=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      qVar2 = QString::size(&in_RDI->m_string);
      in_RDI->m_length = (int)qVar2;
      in_RDI->m_offset = 0;
      if (*(int *)&in_RSI[1].d.ptr != 0) {
        in_RDI->m_file = *(int *)&in_RSI[1].d.ptr;
      }
      in_RDI->m_hash = 0x80000000;
    }
    if (in_RDX != (byte *)0x0) {
      *in_RDX = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

ProString &ProString::append(const ProString &other, bool *pending)
{
    if (other.m_length) {
        if (!m_length) {
            *this = other;
        } else {
            if (m_length != m_string.size())
                m_string = toQString();
            if (pending && !*pending) {
                m_string += QLatin1Char(' ') + other.toQStringView();
            } else {
                m_string += other.toQStringView();
            }
            m_length = m_string.size();
            m_offset = 0;
            if (other.m_file)
                m_file = other.m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}